

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

string * __thiscall
cfgfile::generator::generate_type_of_data_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,field_t *f)

{
  field_type_t fVar1;
  string *psVar2;
  char *pcVar3;
  allocator local_72;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  fVar1 = cfg::field_t::type((field_t *)this);
  switch(fVar1) {
  case scalar_field_type:
  case custom_tag_field_type:
    psVar2 = cfg::field_t::value_type_abi_cxx11_((field_t *)this);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
    return __return_storage_ptr__;
  case no_value_field_type:
    pcVar3 = "bool";
    break;
  case scalar_vector_field_type:
  case vector_of_tags_field_type:
    std::__cxx11::string::string((string *)&local_30,"std::vector< ",&local_71);
    psVar2 = cfg::field_t::value_type_abi_cxx11_((field_t *)this);
    std::operator+(&local_70,&local_30,psVar2);
    std::__cxx11::string::string((string *)&local_50," >",&local_72);
    std::operator+(__return_storage_ptr__,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_30);
    return __return_storage_ptr__;
  default:
    pcVar3 = "void";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,(allocator *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

static inline std::string generate_type_of_data( const cfg::field_t & f )
{
	switch( f.type() )
	{
		case cfg::field_t::no_value_field_type :
			return std::string( "bool" );

		case cfg::field_t::custom_tag_field_type :
		case cfg::field_t::scalar_field_type :
			return f.value_type();

		case cfg::field_t::vector_of_tags_field_type :
		case cfg::field_t::scalar_vector_field_type :
			return std::string( "std::vector< " ) + f.value_type() + std::string( " >" );

		default :
			return std::string( "void" );
	}
}